

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanTrackedObject
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,
          FinalizableObject *object,uint objectIndex,Recycler *recycler)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined8 *in_FS_OFFSET;
  
  if ((recycler->recyclerFlagsTable->Verbose == true) &&
     (bVar4 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,RecyclerPhase), bVar4)) {
    Output::Print(L"Marking 0x%08x during rescan\n",object);
  }
  bVar4 = recycler->inPartialCollectMode;
  bVar5 = Recycler::DoQueueTrackedObject(recycler);
  if (bVar4 == true) {
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x1a0,"(!recycler->DoQueueTrackedObject())",
                         "!recycler->DoQueueTrackedObject()");
      if (!bVar4) {
LAB_0028f8ba:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  else {
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x1a5,"(recycler->DoQueueTrackedObject())",
                         "recycler->DoQueueTrackedObject()");
      if (!bVar4) goto LAB_0028f8ba;
      *puVar2 = 0;
    }
    bVar4 = Recycler::QueueTrackedObject(recycler,object);
    if (!bVar4) {
      return false;
    }
  }
  psVar1 = &(recycler->collectionStats).trackCount;
  *psVar1 = *psVar1 + 1;
  pbVar6 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,objectIndex);
  if ((char)*pbVar6 < '\0') {
    psVar1 = &(recycler->collectionStats).finalizeCount;
    *psVar1 = *psVar1 + 1;
  }
  pbVar7 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,objectIndex);
  *pbVar7 = *pbVar7 & 0xfb;
  return true;
}

Assistant:

bool
SmallFinalizableHeapBlockT<TBlockAttributes>::RescanTrackedObject(FinalizableObject * object, uint objectIndex, Recycler * recycler)
{
    RecyclerVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Marking 0x%08x during rescan\n"), object);
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    if (recycler->inPartialCollectMode)
    {
        Assert(!recycler->DoQueueTrackedObject());
    }
    else
#endif
    {
        Assert(recycler->DoQueueTrackedObject());

        if (!recycler->QueueTrackedObject(object))
        {
            // Failed to add to track stack due to OOM.
            return false;
        }
    }

    RECYCLER_STATS_INC(recycler, trackCount);
    RECYCLER_STATS_INC_IF(this->ObjectInfo(objectIndex) & FinalizeBit, recycler, finalizeCount);

    // We have processed this object as tracked, we can clear the NewTrackBit
    this->ObjectInfo(objectIndex) &= ~NewTrackBit;

    return true;
#else
    // REVIEW: Is this correct? Or should we remove the track bit always?
    return false;
#endif
}